

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_lazy.c
# Opt level: O1

size_t ZSTD_compressBlock_lazy_dedicatedDictSearch
                 (ZSTD_matchState_t *ms,seqStore_t *seqStore,U32 *rep,void *src,size_t srcSize)

{
  int *iEnd;
  undefined8 *puVar1;
  ZSTD_matchState_t *pZVar2;
  seqDef *psVar3;
  bool bVar4;
  undefined8 uVar5;
  seqStore_t *psVar6;
  uint uVar7;
  uint uVar8;
  uint uVar9;
  size_t sVar10;
  ulong uVar11;
  int iVar12;
  int *mEnd;
  BYTE *pBVar13;
  uint uVar14;
  int *piVar15;
  ulong uVar16;
  BYTE *pBVar17;
  int iVar18;
  int *piVar19;
  ulong uVar20;
  int *piVar21;
  ulong uVar22;
  long lVar23;
  size_t ofbCandidate;
  int *local_f0;
  size_t local_d8;
  int *local_d0;
  ulong local_c8;
  seqStore_t *local_c0;
  BYTE *local_b8;
  uint local_b0;
  uint local_ac;
  int *local_a8;
  BYTE *local_a0;
  BYTE *local_98;
  BYTE *local_90;
  int *local_88;
  uint local_7c;
  int *local_78;
  BYTE *local_70;
  uint *local_68;
  ulong local_60;
  ulong local_58;
  ulong local_50;
  ulong local_48;
  ulong local_40;
  ulong local_38;
  
  local_b8 = (ms->window).base;
  uVar8 = (ms->window).dictLimit;
  local_c8 = (ulong)uVar8;
  uVar9 = (ms->cParams).minMatch;
  uVar7 = 6;
  if (uVar9 < 6) {
    uVar7 = uVar9;
  }
  local_b0 = 4;
  if (4 < uVar7) {
    local_b0 = uVar7;
  }
  local_a0 = local_b8 + local_c8;
  uVar9 = *rep;
  pZVar2 = ms->dictMatchState;
  local_a8 = (int *)(pZVar2->window).nextSrc;
  local_90 = (pZVar2->window).base;
  local_70 = local_90 + (pZVar2->window).dictLimit;
  iVar18 = (int)local_a8;
  uVar7 = ((int)src - ((int)local_a0 + (int)local_70)) + iVar18;
  piVar19 = (int *)((long)src + (ulong)(uVar7 == 0));
  if (uVar7 < uVar9) {
    __assert_fail("offset_1 <= dictAndPrefixLength",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_lazy.c"
                  ,0x603,
                  "size_t ZSTD_compressBlock_lazy_generic(ZSTD_matchState_t *, seqStore_t *, U32 *, const void *, size_t, const searchMethod_e, const U32, const ZSTD_dictMode_e)"
                 );
  }
  uVar14 = rep[1];
  if (uVar7 < uVar14) {
    __assert_fail("offset_2 <= dictAndPrefixLength",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_lazy.c"
                  ,0x604,
                  "size_t ZSTD_compressBlock_lazy_generic(ZSTD_matchState_t *, seqStore_t *, U32 *, const void *, size_t, const searchMethod_e, const U32, const ZSTD_dictMode_e)"
                 );
  }
  iEnd = (int *)((long)src + srcSize);
  local_88 = (int *)((long)src + (srcSize - 8));
  ms->lazySkipping = 0;
  local_f0 = (int *)src;
  if (piVar19 < local_88) {
    local_7c = ((int)local_90 - iVar18) + uVar8;
    local_98 = local_90 + -(ulong)local_7c;
    local_78 = iEnd + -8;
    iVar12 = (int)local_b8;
    local_50 = (ulong)((1 - uVar8) - iVar12);
    local_58 = (ulong)(uint)-iVar12;
    local_60 = (ulong)((((iVar18 - uVar8) - (int)local_90) - iVar12) + 1);
    local_c0 = seqStore;
    local_68 = rep;
    do {
      local_d0 = (int *)((long)piVar19 + 1);
      iVar18 = (int)piVar19;
      uVar8 = ((iVar18 - (int)local_b8) - uVar9) + 1;
      piVar15 = (int *)(local_b8 + uVar8);
      if (uVar8 < (uint)local_c8) {
        piVar15 = (int *)(local_90 + (uVar8 - local_7c));
      }
      local_ac = uVar14;
      if ((uVar8 - (uint)local_c8 < 0xfffffffd) && (*piVar15 == *local_d0)) {
        piVar21 = iEnd;
        if (uVar8 < (uint)local_c8) {
          piVar21 = local_a8;
        }
        sVar10 = ZSTD_count_2segments
                           ((BYTE *)((long)piVar19 + 5),(BYTE *)(piVar15 + 1),(BYTE *)iEnd,
                            (BYTE *)piVar21,local_a0);
        uVar20 = sVar10 + 4;
      }
      else {
        uVar20 = 0;
      }
      local_d8 = 999999999;
      if (local_b0 == 6) {
        uVar11 = ZSTD_HcFindBestMatch_dedicatedDictSearch_6
                           (ms,(BYTE *)piVar19,(BYTE *)iEnd,&local_d8);
      }
      else if (local_b0 == 5) {
        uVar11 = ZSTD_HcFindBestMatch_dedicatedDictSearch_5
                           (ms,(BYTE *)piVar19,(BYTE *)iEnd,&local_d8);
      }
      else {
        uVar11 = ZSTD_HcFindBestMatch_dedicatedDictSearch_4
                           (ms,(BYTE *)piVar19,(BYTE *)iEnd,&local_d8);
      }
      uVar22 = uVar20;
      if (uVar20 < uVar11) {
        uVar22 = uVar11;
      }
      if (uVar22 < 4) {
        uVar20 = (long)piVar19 - (long)local_f0;
        piVar19 = (int *)((long)piVar19 + (uVar20 >> 8) + 1);
        ms->lazySkipping = (uint)(0x7ff < uVar20);
        uVar14 = local_ac;
      }
      else {
        piVar15 = piVar19;
        uVar16 = local_d8;
        if (uVar11 <= uVar20) {
          piVar15 = local_d0;
          uVar16 = 1;
        }
        local_38 = (ulong)(((int)local_50 + iVar18) - uVar9);
        local_40 = (ulong)(((int)local_58 + iVar18) - uVar9);
        local_48 = (ulong)(((int)local_60 + iVar18) - uVar9);
        lVar23 = 0;
        local_d0 = piVar15;
        do {
          if (local_88 <= (int *)(lVar23 + (long)piVar19)) break;
          piVar21 = (int *)((long)piVar19 + lVar23 + 1);
          iVar18 = (int)lVar23;
          uVar8 = (int)local_40 + iVar18 + 1;
          piVar15 = (int *)(local_b8 + uVar8);
          if (uVar8 < (uint)local_c8) {
            piVar15 = (int *)(local_90 + (uint)((int)local_48 + iVar18));
          }
          if (((uint)((int)local_38 + iVar18) < 0xfffffffd) && (*piVar15 == *piVar21)) {
            mEnd = iEnd;
            if (uVar8 < (uint)local_c8) {
              mEnd = local_a8;
            }
            sVar10 = ZSTD_count_2segments
                               ((BYTE *)((long)piVar19 + lVar23 + 5),(BYTE *)(piVar15 + 1),
                                (BYTE *)iEnd,(BYTE *)mEnd,local_a0);
            uVar8 = (uint)uVar16;
            if (uVar8 == 0) goto LAB_006e6c68;
            if (sVar10 < 0xfffffffffffffffc) {
              uVar7 = 0x1f;
              if (uVar8 != 0) {
                for (; uVar8 >> uVar7 == 0; uVar7 = uVar7 - 1) {
                }
              }
              if ((int)((uVar7 ^ 0x1f) + (int)uVar22 * 3 + -0x1e) < (int)(sVar10 + 4) * 3) {
                uVar16 = 1;
                uVar22 = sVar10 + 4;
                local_d0 = piVar21;
              }
            }
          }
          local_d8 = 999999999;
          if (local_b0 == 6) {
            uVar20 = ZSTD_HcFindBestMatch_dedicatedDictSearch_6
                               (ms,(BYTE *)piVar21,(BYTE *)iEnd,&local_d8);
          }
          else if (local_b0 == 5) {
            uVar20 = ZSTD_HcFindBestMatch_dedicatedDictSearch_5
                               (ms,(BYTE *)piVar21,(BYTE *)iEnd,&local_d8);
          }
          else {
            uVar20 = ZSTD_HcFindBestMatch_dedicatedDictSearch_4
                               (ms,(BYTE *)piVar21,(BYTE *)iEnd,&local_d8);
          }
          uVar8 = (uint)local_d8;
          if ((uVar8 == 0) || (uVar7 = (uint)uVar16, uVar7 == 0)) {
LAB_006e6c68:
            __assert_fail("val != 0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/../common/bits.h"
                          ,0xab,"unsigned int ZSTD_highbit32(U32)");
          }
          bVar4 = true;
          if (3 < uVar20) {
            iVar18 = 0x1f;
            if (uVar8 != 0) {
              for (; uVar8 >> iVar18 == 0; iVar18 = iVar18 + -1) {
              }
            }
            uVar8 = 0x1f;
            if (uVar7 != 0) {
              for (; uVar7 >> uVar8 == 0; uVar8 = uVar8 - 1) {
              }
            }
            if ((int)((uVar8 ^ 0x1f) + (int)uVar22 * 4 + -0x1b) < (int)uVar20 * 4 - iVar18) {
              bVar4 = false;
              uVar16 = local_d8;
              uVar22 = uVar20;
              local_d0 = piVar21;
            }
          }
          lVar23 = lVar23 + 1;
        } while (!bVar4);
        piVar19 = local_d0;
        uVar8 = uVar9;
        uVar14 = local_ac;
        if (3 < uVar16) {
          uVar20 = (long)local_d0 + (-(long)local_b8 - uVar16) + -0xfffffffd;
          pBVar13 = local_b8;
          pBVar17 = local_a0;
          if ((uint)uVar20 < (uint)local_c8) {
            pBVar13 = local_98;
            pBVar17 = local_70;
          }
          if ((local_f0 < local_d0) && (uVar20 = uVar20 & 0xffffffff, pBVar17 < pBVar13 + uVar20)) {
            pBVar13 = pBVar13 + uVar20;
            do {
              piVar15 = (int *)((long)piVar19 + -1);
              pBVar13 = pBVar13 + -1;
              if ((*(BYTE *)piVar15 != *pBVar13) ||
                 (uVar22 = uVar22 + 1, piVar19 = piVar15, piVar15 <= local_f0)) break;
            } while (pBVar17 < pBVar13);
          }
          uVar8 = (U32)uVar16 - 3;
          uVar14 = uVar9;
        }
        if (local_c0->maxNbSeq <=
            (ulong)((long)local_c0->sequences - (long)local_c0->sequencesStart >> 3)) {
LAB_006e6c87:
          __assert_fail("(size_t)(seqStorePtr->sequences - seqStorePtr->sequencesStart) < seqStorePtr->maxNbSeq"
                        ,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_compress_internal.h"
                        ,0x29d,
                        "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                       );
        }
        if (0x20000 < local_c0->maxNbLit) {
LAB_006e6ca6:
          __assert_fail("seqStorePtr->maxNbLit <= 128 KB",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_compress_internal.h"
                        ,0x29f,
                        "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                       );
        }
        uVar20 = (long)piVar19 - (long)local_f0;
        pBVar17 = local_c0->lit;
        if (local_c0->litStart + local_c0->maxNbLit < pBVar17 + uVar20) {
LAB_006e6d03:
          __assert_fail("seqStorePtr->lit + litLength <= seqStorePtr->litStart + seqStorePtr->maxNbLit"
                        ,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_compress_internal.h"
                        ,0x2a0,
                        "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                       );
        }
        if (iEnd < piVar19) {
LAB_006e6ce4:
          __assert_fail("literals + litLength <= litLimit",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_compress_internal.h"
                        ,0x2a1,
                        "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                       );
        }
        local_d0 = piVar19;
        if (local_78 < piVar19) {
          ZSTD_safecopyLiterals(pBVar17,(BYTE *)local_f0,(BYTE *)piVar19,(BYTE *)local_78);
        }
        else {
          uVar5 = *(undefined8 *)(local_f0 + 2);
          *(undefined8 *)pBVar17 = *(undefined8 *)local_f0;
          *(undefined8 *)(pBVar17 + 8) = uVar5;
          if (0x10 < uVar20) {
            pBVar17 = local_c0->lit;
            if ((BYTE *)0xffffffffffffffe0 < pBVar17 + 0x10 + (-0x10 - (long)(local_f0 + 4))) {
              __assert_fail("diff >= WILDCOPY_VECLEN || diff <= -WILDCOPY_VECLEN",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/../common/zstd_internal.h"
                            ,0xe9,
                            "void ZSTD_wildcopy(void *, const void *, ptrdiff_t, const ZSTD_overlap_e)"
                           );
            }
            uVar5 = *(undefined8 *)(local_f0 + 6);
            *(undefined8 *)(pBVar17 + 0x10) = *(undefined8 *)(local_f0 + 4);
            *(undefined8 *)(pBVar17 + 0x18) = uVar5;
            if (0x20 < (long)uVar20) {
              lVar23 = 0;
              do {
                puVar1 = (undefined8 *)((long)local_f0 + lVar23 + 0x20);
                uVar5 = puVar1[1];
                pBVar13 = pBVar17 + lVar23 + 0x20;
                *(undefined8 *)pBVar13 = *puVar1;
                *(undefined8 *)(pBVar13 + 8) = uVar5;
                puVar1 = (undefined8 *)((long)local_f0 + lVar23 + 0x30);
                uVar5 = puVar1[1];
                *(undefined8 *)(pBVar13 + 0x10) = *puVar1;
                *(undefined8 *)(pBVar13 + 0x18) = uVar5;
                lVar23 = lVar23 + 0x20;
              } while (pBVar13 + 0x20 < pBVar17 + uVar20);
            }
          }
        }
        rep = local_68;
        psVar6 = local_c0;
        local_c0->lit = local_c0->lit + uVar20;
        if (0xffff < uVar20) {
          if (local_c0->longLengthType != ZSTD_llt_none) {
            __assert_fail("seqStorePtr->longLengthType == ZSTD_llt_none",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_compress_internal.h"
                          ,0x2b2,
                          "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                         );
          }
          local_c0->longLengthType = ZSTD_llt_literalLength;
          local_c0->longLengthPos =
               (U32)((ulong)((long)local_c0->sequences - (long)local_c0->sequencesStart) >> 3);
        }
        psVar3 = local_c0->sequences;
        psVar3->litLength = (U16)uVar20;
        psVar3->offBase = (U32)uVar16;
        if (uVar22 < 3) {
LAB_006e6cc5:
          __assert_fail("matchLength >= MINMATCH",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_compress_internal.h"
                        ,700,
                        "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                       );
        }
        if (0xffff < uVar22 - 3) {
          if (local_c0->longLengthType != ZSTD_llt_none) {
LAB_006e6d22:
            __assert_fail("seqStorePtr->longLengthType == ZSTD_llt_none",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_compress_internal.h"
                          ,0x2bf,
                          "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                         );
          }
          local_c0->longLengthType = ZSTD_llt_matchLength;
          local_c0->longLengthPos =
               (U32)((ulong)((long)psVar3 - (long)local_c0->sequencesStart) >> 3);
        }
        psVar3->mlBase = (U16)(uVar22 - 3);
        local_c0->sequences = psVar3 + 1;
        if (ms->lazySkipping != 0) {
          ms->lazySkipping = 0;
        }
        piVar19 = (int *)((long)local_d0 + uVar22);
        pBVar17 = local_98;
        local_f0 = piVar19;
        do {
          uVar9 = uVar8;
          if (local_88 < piVar19) break;
          uVar9 = ((int)piVar19 - (int)local_b8) - uVar14;
          pBVar13 = local_b8;
          if (uVar9 < (uint)local_c8) {
            pBVar13 = pBVar17;
          }
          if ((uVar9 - (uint)local_c8 < 0xfffffffd) && (*(int *)(pBVar13 + uVar9) == *piVar19)) {
            piVar15 = iEnd;
            if (uVar9 < (uint)local_c8) {
              piVar15 = local_a8;
            }
            sVar10 = ZSTD_count_2segments
                               ((BYTE *)(piVar19 + 1),(BYTE *)((long)(pBVar13 + uVar9) + 4),
                                (BYTE *)iEnd,(BYTE *)piVar15,local_a0);
            if (psVar6->maxNbSeq <=
                (ulong)((long)psVar6->sequences - (long)psVar6->sequencesStart >> 3))
            goto LAB_006e6c87;
            if (0x20000 < psVar6->maxNbLit) goto LAB_006e6ca6;
            pBVar17 = psVar6->lit;
            if (psVar6->litStart + psVar6->maxNbLit < pBVar17) goto LAB_006e6d03;
            if (iEnd < local_f0) goto LAB_006e6ce4;
            if (local_78 < local_f0) {
              ZSTD_safecopyLiterals(pBVar17,(BYTE *)local_f0,(BYTE *)local_f0,(BYTE *)local_78);
            }
            else {
              uVar5 = *(undefined8 *)(local_f0 + 2);
              *(undefined8 *)pBVar17 = *(undefined8 *)local_f0;
              *(undefined8 *)(pBVar17 + 8) = uVar5;
            }
            psVar3 = psVar6->sequences;
            psVar3->litLength = 0;
            psVar3->offBase = 1;
            if (sVar10 + 4 < 3) goto LAB_006e6cc5;
            if (0xffff < sVar10 + 1) {
              if (psVar6->longLengthType != ZSTD_llt_none) goto LAB_006e6d22;
              psVar6->longLengthType = ZSTD_llt_matchLength;
              psVar6->longLengthPos =
                   (U32)((ulong)((long)psVar3 - (long)psVar6->sequencesStart) >> 3);
            }
            psVar3->mlBase = (U16)(sVar10 + 1);
            psVar6->sequences = psVar3 + 1;
            piVar19 = (int *)((long)piVar19 + sVar10 + 4);
            bVar4 = true;
            pBVar17 = local_98;
            uVar9 = uVar8;
            uVar8 = uVar14;
            local_f0 = piVar19;
          }
          else {
            bVar4 = false;
            uVar9 = uVar14;
          }
          uVar14 = uVar9;
          uVar9 = uVar8;
        } while (bVar4);
      }
    } while (piVar19 < local_88);
  }
  *rep = uVar9;
  rep[1] = uVar14;
  return (long)iEnd - (long)local_f0;
}

Assistant:

size_t ZSTD_compressBlock_lazy_dedicatedDictSearch(
        ZSTD_matchState_t* ms, seqStore_t* seqStore, U32 rep[ZSTD_REP_NUM],
        void const* src, size_t srcSize)
{
    return ZSTD_compressBlock_lazy_generic(ms, seqStore, rep, src, srcSize, search_hashChain, 1, ZSTD_dedicatedDictSearch);
}